

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

bool __thiscall AWeapon::Use(AWeapon *this,bool pickup)

{
  AWeapon *pAVar1;
  AInventory *pAVar2;
  AWeapon *pAVar3;
  AWeapon *useweap;
  
  if (((this->super_AStateProvider).super_AInventory.field_0x4fd & 4) != 0) {
    return false;
  }
  pAVar1 = (this->SisterWeapon).field_0.p;
  pAVar3 = this;
  if (pAVar1 != (AWeapon *)0x0) {
    if ((*(byte *)((long)&(pAVar1->super_AStateProvider).super_AInventory.super_AActor.
                          super_DThinker.super_DObject + 0x20) & 0x20) == 0) {
      if ((((((((this->SisterWeapon).field_0.p)->super_AStateProvider).super_AInventory.field_0x4fd
             & 4) == 0) ||
           (pAVar2 = AActor::FindInventory
                               ((this->super_AStateProvider).super_AInventory.Owner.field_0.p,
                                (PClassActor *)APowerWeaponLevel2::RegistrationInfo.MyClass,true),
           pAVar2 == (AInventory *)0x0)) ||
          (pAVar3 = (this->SisterWeapon).field_0.p, pAVar3 == (AWeapon *)0x0)) ||
         ((*(byte *)((long)&(pAVar3->super_AStateProvider).super_AInventory.super_AActor.
                            super_DThinker.super_DObject + 0x20) & 0x20) == 0)) goto LAB_004ad882;
      pAVar3 = (AWeapon *)0x0;
    }
    (this->SisterWeapon).field_0.p = (AWeapon *)0x0;
  }
LAB_004ad882:
  if ((((this->super_AStateProvider).super_AInventory.Owner.field_0.p)->player != (player_t *)0x0)
     && (((this->super_AStateProvider).super_AInventory.Owner.field_0.p)->player->ReadyWeapon !=
         pAVar3)) {
    ((this->super_AStateProvider).super_AInventory.Owner.field_0.p)->player->PendingWeapon = pAVar3;
  }
  return false;
}

Assistant:

bool AWeapon::Use (bool pickup)
{
	AWeapon *useweap = this;

	// Powered up weapons cannot be used directly.
	if (WeaponFlags & WIF_POWERED_UP) return false;

	// If the player is powered-up, use the alternate version of the
	// weapon, if one exists.
	if (SisterWeapon != NULL &&
		SisterWeapon->WeaponFlags & WIF_POWERED_UP &&
		Owner->FindInventory (RUNTIME_CLASS(APowerWeaponLevel2), true))
	{
		useweap = SisterWeapon;
	}
	if (Owner->player != NULL && Owner->player->ReadyWeapon != useweap)
	{
		Owner->player->PendingWeapon = useweap;
	}
	// Return false so that the weapon is not removed from the inventory.
	return false;
}